

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.cpp
# Opt level: O3

void sqlcheck::ValidateColorMode(Configuration *state)

{
  bool *in_RDX;
  string local_28;
  
  GetBooleanString_abi_cxx11_(&local_28,(sqlcheck *)state,in_RDX);
  printf("> %s :: %s\n","COLOR MODE   ",local_28._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void ValidateColorMode(const Configuration &state) {
    printf("> %s :: %s\n", "COLOR MODE   ",
           GetBooleanString(state.color_mode).c_str());
}